

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_batchnorm(NetOptimize *this)

{
  long lVar1;
  int *piVar2;
  allocator_type *paVar3;
  Allocator *pAVar4;
  value_type pLVar5;
  FILE *__stream;
  bool bVar6;
  int iVar7;
  reference ppLVar8;
  reference pvVar9;
  size_type sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  reference pvVar13;
  bool *pbVar14;
  reference pvVar15;
  int iVar16;
  long in_RDI;
  float fVar17;
  double dVar18;
  float fVar19;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_3;
  float *bias;
  float *weight;
  int weight_per_outch;
  float sqrt_var;
  int i_1;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  float eps;
  int channels;
  BatchNorm *batchnorm;
  DeconvolutionDepthWise *deconvolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  int i_2;
  float *ptr;
  int size;
  int in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  float in_stack_fffffffffffffd10;
  value_type in_stack_fffffffffffffd14;
  Allocator *in_stack_fffffffffffffd18;
  allocator_type *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  Mat *in_stack_fffffffffffffd30;
  int local_22c;
  int local_21c;
  Mat local_200;
  float local_1b4;
  int local_1b0;
  vector<float,_std::allocator<float>_> local_1a8 [2];
  vector<float,_std::allocator<float>_> local_178;
  float local_160;
  int local_15c;
  value_type local_158;
  value_type local_150;
  size_type local_148;
  value_type local_13c;
  size_type local_138;
  ulong local_130;
  Mat *local_120;
  int local_10c;
  undefined4 *local_108;
  int local_100;
  undefined4 local_fc;
  bool *local_f8;
  int local_f0;
  undefined4 local_ec;
  Mat *local_e8;
  bool *local_e0;
  bool *local_d8;
  bool *local_d0;
  pointer *local_c8;
  long local_c0;
  bool *local_b8;
  long local_b0;
  string *local_a8;
  long local_a0;
  bool *local_98;
  long local_90;
  bool *local_88;
  long local_80;
  pointer *local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_5c;
  Mat *local_58;
  int local_50;
  undefined4 local_4c;
  bool *local_48;
  int local_30;
  undefined4 local_2c;
  Mat *local_28;
  void *local_20;
  void *local_10;
  bool *local_8;
  
  local_130 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58))
  ;
  local_138 = 0;
  do {
    if (local_130 <= local_138) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_138)
    ;
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if (!bVar6) {
      ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_138);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->tops,0);
      local_13c = *pvVar9;
      local_148 = local_138;
      do {
        do {
          do {
            local_148 = local_148 + 1;
            if (local_130 <= local_148) goto LAB_0017b4fa;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_148);
            bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)
                                    ,(char *)CONCAT44(in_stack_fffffffffffffd0c,
                                                      in_stack_fffffffffffffd08));
          } while (bVar6);
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_148);
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar8)->bottoms);
        } while (sVar10 != 1);
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_148);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,0);
      } while (*pvVar9 != local_13c);
LAB_0017b4fa:
      if (local_148 != local_130) {
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_138);
        local_150 = *ppLVar8;
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_148);
        __stream = _stderr;
        local_158 = *ppLVar8;
        uVar11 = std::__cxx11::string::c_str();
        uVar12 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_deconvolutiondepthwise_batchnorm %s %s\n",uVar11,uVar12);
        local_15c = *(int *)&local_158[1]._vptr_Layer;
        local_160 = *(float *)((long)&local_158[1]._vptr_Layer + 4);
        std::allocator<float>::allocator((allocator<float> *)0x17b60c);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30,
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   in_stack_fffffffffffffd20);
        std::allocator<float>::~allocator((allocator<float> *)0x17b638);
        std::allocator<float>::allocator((allocator<float> *)0x17b65d);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30,
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   in_stack_fffffffffffffd20);
        std::allocator<float>::~allocator((allocator<float> *)0x17b689);
        for (local_1b0 = 0; local_1b0 < local_15c; local_1b0 = local_1b0 + 1) {
          local_78 = &local_158[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          local_80 = (long)local_1b0;
          dVar18 = std::sqrt((double)(ulong)(uint)((float)(*local_78)[local_80] + local_160));
          local_1b4 = SUB84(dVar18,0);
          local_88 = &local_158[2].support_tensor_storage;
          local_90 = (long)local_1b0;
          fVar17 = *(float *)(*(long *)local_88 + local_90 * 4);
          local_98 = &local_158[1].one_blob_only;
          local_a0 = (long)local_1b0;
          local_a8 = &local_158[1].name;
          local_b0 = (long)local_1b0;
          fVar19 = (*(float *)(*(long *)local_98 + local_a0 * 4) *
                   *(float *)(*(long *)local_a8 + local_b0 * 4)) / local_1b4;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&local_178,(long)local_1b0);
          *pvVar13 = fVar17 - fVar19;
          local_b8 = &local_158[1].one_blob_only;
          local_c0 = (long)local_1b0;
          fVar17 = *(float *)(*(long *)local_b8 + local_c0 * 4) / local_1b4;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              (local_1a8,(long)local_1b0);
          *pvVar13 = fVar17;
        }
        if (*(int *)((long)&local_150[1].type._M_string_length + 4) == 0) {
          *(undefined4 *)((long)&local_150[1].type._M_string_length + 4) = 1;
          local_58 = &local_200;
          local_5c = local_15c;
          local_68 = 4;
          local_70 = 0;
          local_200.data = (void *)0x0;
          local_200.refcount = (int *)0x0;
          local_200.elemsize = 0;
          local_200.elempack = 0;
          local_200.allocator = (Allocator *)0x0;
          local_200.dims = 0;
          local_200.w = 0;
          local_200.h = 0;
          local_200.d = 0;
          local_200.c = 0;
          local_200.cstep = 0;
          ncnn::Mat::create(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
                            (size_t)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
          pLVar5 = local_150;
          pbVar14 = &local_150[2].support_tensor_storage;
          local_e8 = &local_200;
          local_e0 = pbVar14;
          if ((Mat *)pbVar14 != local_e8) {
            if (local_200.refcount != (int *)0x0) {
              local_ec = 1;
              LOCK();
              local_f0 = *local_200.refcount;
              *local_200.refcount = *local_200.refcount + 1;
              UNLOCK();
            }
            lVar1._0_1_ = local_150[2].support_reserved_6;
            lVar1._1_1_ = local_150[2].support_reserved_7;
            lVar1._2_1_ = local_150[2].support_reserved_8;
            lVar1._3_1_ = local_150[2].support_reserved_9;
            lVar1._4_1_ = local_150[2].support_reserved_10;
            lVar1._5_1_ = local_150[2].support_reserved_11;
            lVar1._6_1_ = local_150[2].support_reserved_12;
            lVar1._7_1_ = local_150[2].support_reserved_13;
            local_48 = pbVar14;
            if (lVar1 != 0) {
              piVar2 = *(int **)&local_150[2].support_reserved_6;
              local_4c = 0xffffffff;
              LOCK();
              local_50 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (local_50 == 1) {
                if (*(long *)&local_150[2].type == 0) {
                  local_10 = *(void **)pbVar14;
                  if (local_10 != (void *)0x0) {
                    free(local_10);
                  }
                }
                else {
                  uVar11._0_1_ = local_150[2].support_tensor_storage;
                  uVar11._1_1_ = local_150[2].support_reserved_00;
                  uVar11._2_1_ = local_150[2].support_reserved_0;
                  uVar11._3_1_ = local_150[2].support_reserved_1;
                  uVar11._4_1_ = local_150[2].support_reserved_2;
                  uVar11._5_1_ = local_150[2].support_reserved_3;
                  uVar11._6_1_ = local_150[2].support_reserved_4;
                  uVar11._7_1_ = local_150[2].support_reserved_5;
                  (**(code **)(**(long **)&local_150[2].type + 0x18))
                            (*(long **)&local_150[2].type,uVar11);
                }
              }
            }
            pLVar5[2].support_tensor_storage = false;
            pLVar5[2].support_reserved_00 = false;
            pLVar5[2].support_reserved_0 = false;
            pLVar5[2].support_reserved_1 = false;
            pLVar5[2].support_reserved_2 = false;
            pLVar5[2].support_reserved_3 = false;
            pLVar5[2].support_reserved_4 = false;
            pLVar5[2].support_reserved_5 = false;
            pLVar5[2].userdata = (void *)0x0;
            pLVar5[2].typeindex = 0;
            *(undefined4 *)&pLVar5[2].type._M_string_length = 0;
            *(undefined4 *)((long)&pLVar5[2].type._M_string_length + 4) = 0;
            *(undefined4 *)&pLVar5[2].type.field_2 = 0;
            *(undefined4 *)((long)&pLVar5[2].type.field_2 + 4) = 0;
            *(undefined4 *)((long)&pLVar5[2].type.field_2 + 8) = 0;
            *(undefined8 *)&pLVar5[2].name = 0;
            pLVar5[2].support_reserved_6 = false;
            pLVar5[2].support_reserved_7 = false;
            pLVar5[2].support_reserved_8 = false;
            pLVar5[2].support_reserved_9 = false;
            pLVar5[2].support_reserved_10 = false;
            pLVar5[2].support_reserved_11 = false;
            pLVar5[2].support_reserved_12 = false;
            pLVar5[2].support_reserved_13 = false;
            *(void **)pbVar14 = local_e8->data;
            *(int **)&pLVar5[2].support_reserved_6 = local_e8->refcount;
            pLVar5[2].userdata = (void *)local_e8->elemsize;
            pLVar5[2].typeindex = local_e8->elempack;
            *(Allocator **)&pLVar5[2].type = local_e8->allocator;
            *(int *)&pLVar5[2].type._M_string_length = local_e8->dims;
            *(int *)((long)&pLVar5[2].type._M_string_length + 4) = local_e8->w;
            *(int *)&pLVar5[2].type.field_2 = local_e8->h;
            *(int *)((long)&pLVar5[2].type.field_2 + 4) = local_e8->d;
            *(int *)((long)&pLVar5[2].type.field_2 + 8) = local_e8->c;
            *(size_t *)&pLVar5[2].name = local_e8->cstep;
          }
          in_stack_fffffffffffffd30 = &local_200;
          local_120 = in_stack_fffffffffffffd30;
          local_d8 = pbVar14;
          local_28 = in_stack_fffffffffffffd30;
          if (local_200.refcount != (int *)0x0) {
            local_2c = 0xffffffff;
            LOCK();
            local_30 = *local_200.refcount;
            *local_200.refcount = *local_200.refcount + -1;
            UNLOCK();
            if (local_30 == 1) {
              if (local_200.allocator == (Allocator *)0x0) {
                local_20 = local_200.data;
                if (local_200.data != (void *)0x0) {
                  free(local_200.data);
                }
              }
              else {
                (*(local_200.allocator)->_vptr_Allocator[3])(local_200.allocator,local_200.data);
              }
            }
          }
          in_stack_fffffffffffffd30->data = (void *)0x0;
          in_stack_fffffffffffffd30->elemsize = 0;
          in_stack_fffffffffffffd30->elempack = 0;
          in_stack_fffffffffffffd30->dims = 0;
          in_stack_fffffffffffffd30->w = 0;
          in_stack_fffffffffffffd30->h = 0;
          in_stack_fffffffffffffd30->d = 0;
          in_stack_fffffffffffffd30->c = 0;
          in_stack_fffffffffffffd30->cstep = 0;
          in_stack_fffffffffffffd30->refcount = (int *)0x0;
          local_f8 = &local_150[2].support_tensor_storage;
          local_fc = 0;
          local_100 = (int)*(undefined8 *)&local_150[2].name *
                      *(int *)((long)&local_150[2].type.field_2 + 8);
          local_108 = *(undefined4 **)local_f8;
          for (local_10c = 0; local_8 = local_f8, local_10c < local_100; local_10c = local_10c + 1)
          {
            *local_108 = 0;
            local_108 = local_108 + 1;
          }
        }
        iVar7 = *(int *)&local_150[1].type.field_2 / local_15c;
        local_c8 = &local_150[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        paVar3 = (allocator_type *)*local_c8;
        local_d0 = &local_150[2].support_tensor_storage;
        pAVar4 = *(Allocator **)local_d0;
        in_stack_fffffffffffffd18 = pAVar4;
        in_stack_fffffffffffffd20 = paVar3;
        for (local_21c = 0; local_21c < local_15c; local_21c = local_21c + 1) {
          iVar16 = iVar7 * local_21c;
          for (local_22c = 0; local_22c < iVar7; local_22c = local_22c + 1) {
            pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                (local_1a8,(long)local_21c);
            *(float *)(paVar3 + (long)local_22c * 4 + (long)iVar16 * 4) =
                 *pvVar13 * *(float *)(paVar3 + (long)local_22c * 4 + (long)iVar16 * 4);
          }
          in_stack_fffffffffffffd10 =
               *(float *)((long)&pAVar4->_vptr_Allocator + (long)local_21c * 4);
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              (local_1a8,(long)local_21c);
          in_stack_fffffffffffffd14 = *pvVar13;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&local_178,(long)local_21c);
          *(float *)((long)&pAVar4->_vptr_Allocator + (long)local_21c * 4) =
               in_stack_fffffffffffffd10 * in_stack_fffffffffffffd14 + *pvVar13;
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd20);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd20);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_158->tops,0);
        iVar7 = *pvVar9;
        in_stack_fffffffffffffd08 = iVar7;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_150->tops,0);
        *pvVar9 = in_stack_fffffffffffffd08;
        in_stack_fffffffffffffd0c = (int)local_138;
        pvVar15 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar7);
        pvVar15->producer = in_stack_fffffffffffffd0c;
        std::__cxx11::string::operator=((string *)&local_158->type,"ncnnfused");
      }
    }
    local_138 = local_138 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - BatchNorm to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_batchnorm %s %s\n", deconvolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                deconvolutiondepthwise->bias_term = 1;
                deconvolutiondepthwise->bias_data = ncnn::Mat(channels);
                deconvolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolutiondepthwise->weight_data_size / channels;

            float* weight = deconvolutiondepthwise->weight_data;
            float* bias = deconvolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}